

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateGLImpl.cpp
# Opt level: O3

void __thiscall
Diligent::PipelineStateGLImpl::
PipelineBuilder<Diligent::GraphicsPipelineStateCreateInfo,_Diligent::GraphicsPipelineStateCreateInfoX>
::HandleWaitingShaders
          (PipelineBuilder<Diligent::GraphicsPipelineStateCreateInfo,_Diligent::GraphicsPipelineStateCreateInfoX>
           *this,bool WaitForCompletion)

{
  pointer ppSVar1;
  bool bVar2;
  SHADER_STATUS SVar3;
  State SVar4;
  char (*in_RCX) [33];
  pointer ppSVar5;
  string msg;
  string local_58;
  PipelineBuilder<Diligent::GraphicsPipelineStateCreateInfo,_Diligent::GraphicsPipelineStateCreateInfoX>
  *local_38;
  
  if ((this->super_PipelineBuilderBase).m_State != WaitingShaders) {
    FormatString<char[26],char[33]>
              (&local_58,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_State == State::WaitingShaders",in_RCX);
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"HandleWaitingShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
               ,0x158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  ppSVar5 = (this->super_PipelineBuilderBase).m_Shaders.
            super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppSVar1 = (this->super_PipelineBuilderBase).m_Shaders.
            super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  SVar4 = LinkingPrograms;
  local_38 = this;
  if (ppSVar5 == ppSVar1) {
LAB_002dc69c:
    (local_38->super_PipelineBuilderBase).m_State = SVar4;
    return;
  }
  bVar2 = true;
  do {
    while (SVar3 = ShaderGLImpl::GetStatus(*ppSVar5,WaitForCompletion), SVar3 == SHADER_STATUS_READY
          ) {
LAB_002dc671:
      ppSVar5 = ppSVar5 + 1;
      if (ppSVar5 == ppSVar1) {
        SVar4 = LinkingPrograms;
        if (!bVar2) {
          return;
        }
        goto LAB_002dc69c;
      }
    }
    if (SVar3 != SHADER_STATUS_COMPILING) {
      if (SVar3 != SHADER_STATUS_FAILED) {
        FormatString<char[25]>(&local_58,(char (*) [25])"Unexpected shader status");
        DebugAssertionFailed
                  (local_58._M_dataplus._M_p,"HandleWaitingShaders",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
                   ,0x16b);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        goto LAB_002dc671;
      }
      SVar4 = Failed;
      goto LAB_002dc69c;
    }
    ppSVar5 = ppSVar5 + 1;
    bVar2 = false;
    if (ppSVar5 == ppSVar1) {
      return;
    }
  } while( true );
}

Assistant:

void HandleWaitingShaders(bool WaitForCompletion)
    {
        VERIFY_EXPR(m_State == State::WaitingShaders);
        bool AllShaderReady = true;
        for (ShaderGLImpl* pShaderGL : m_Shaders)
        {
            SHADER_STATUS Status = pShaderGL->GetStatus(WaitForCompletion);
            switch (Status)
            {
                case SHADER_STATUS_COMPILING:
                    AllShaderReady = false;
                    break;

                case SHADER_STATUS_FAILED:
                    m_State = State::Failed;
                    return;

                case SHADER_STATUS_READY:
                    break;

                default:
                    UNEXPECTED("Unexpected shader status");
            }
        }

        if (AllShaderReady)
        {
            m_State = State::LinkingPrograms;
        }
    }